

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O0

bool __thiscall
Opcode::AABBTreeCollider::Collide
          (AABBTreeCollider *this,BVTCache *cache,Matrix4x4 *world0,Matrix4x4 *world1)

{
  MeshInterface *pMVar1;
  bool bVar2;
  AABBCollisionTree *T1_3;
  AABBCollisionTree *T0_3;
  AABBQuantizedTree *T1_2;
  AABBQuantizedTree *T0_2;
  AABBNoLeafTree *T1_1;
  AABBNoLeafTree *T0_1;
  AABBQuantizedNoLeafTree *T1;
  AABBQuantizedNoLeafTree *T0;
  bool Status;
  Matrix4x4 *world1_local;
  Matrix4x4 *world0_local;
  BVTCache *cache_local;
  AABBTreeCollider *this_local;
  
  if ((cache->Model0 == (Model *)0x0) || (cache->Model1 == (Model *)0x0)) {
    this_local._7_1_ = false;
  }
  else if ((((cache->Model0->super_BaseModel).mModelCode & 2) == 0) ==
           (((cache->Model1->super_BaseModel).mModelCode & 2) == 0)) {
    if (((cache->Model0->super_BaseModel).mModelCode & 1) ==
        ((cache->Model1->super_BaseModel).mModelCode & 1)) {
      pMVar1 = (cache->Model1->super_BaseModel).mIMesh;
      this->mIMesh0 = (cache->Model0->super_BaseModel).mIMesh;
      this->mIMesh1 = pMVar1;
      if ((this->mIMesh0 == (MeshInterface *)0x0) || (this->mIMesh1 == (MeshInterface *)0x0)) {
        bVar2 = false;
      }
      else {
        bVar2 = true;
      }
      if (bVar2) {
        if (((cache->Model0->super_BaseModel).mModelCode & 2) == 0) {
          if (((cache->Model0->super_BaseModel).mModelCode & 1) == 0) {
            T0._7_1_ = Collide(this,(AABBCollisionTree *)(cache->Model0->super_BaseModel).mTree,
                               (AABBCollisionTree *)(cache->Model1->super_BaseModel).mTree,world0,
                               world1,&cache->super_Pair);
          }
          else {
            T0._7_1_ = Collide(this,(AABBQuantizedTree *)(cache->Model0->super_BaseModel).mTree,
                               (AABBQuantizedTree *)(cache->Model1->super_BaseModel).mTree,world0,
                               world1,&cache->super_Pair);
          }
        }
        else if (((cache->Model0->super_BaseModel).mModelCode & 1) == 0) {
          T0._7_1_ = Collide(this,(AABBNoLeafTree *)(cache->Model0->super_BaseModel).mTree,
                             (AABBNoLeafTree *)(cache->Model1->super_BaseModel).mTree,world0,world1,
                             &cache->super_Pair);
        }
        else {
          T0._7_1_ = Collide(this,(AABBQuantizedNoLeafTree *)(cache->Model0->super_BaseModel).mTree,
                             (AABBQuantizedNoLeafTree *)(cache->Model1->super_BaseModel).mTree,
                             world0,world1,&cache->super_Pair);
        }
        this_local._7_1_ = T0._7_1_;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AABBTreeCollider::Collide(BVTCache& cache, const Matrix4x4* world0, const Matrix4x4* world1)
{
	// Checkings
	if(!cache.Model0 || !cache.Model1)								return false;
	if(cache.Model0->HasLeafNodes()!=cache.Model1->HasLeafNodes())	return false;
	if(cache.Model0->IsQuantized()!=cache.Model1->IsQuantized())	return false;

	/*
	
	  Rules:
		- perform hull test
		- when hulls collide, disable hull test
		- if meshes overlap, reset countdown
		- if countdown reaches 0, enable hull test

	*/

#ifdef __MESHMERIZER_H__
	// Handle hulls
	if(cache.HullTest)
	{
		if(cache.Model0->GetHull() && cache.Model1->GetHull())
		{
			struct Local
			{
				static Point* SVCallback(const Point& sv, udword& previndex, udword user_data)
				{
					CollisionHull* Hull = (CollisionHull*)user_data;
					previndex = Hull->ComputeSupportingVertex(sv, previndex);
					return (Point*)&Hull->GetVerts()[previndex];
				}
			};

			bool Collide;

			if(0)
			{
				static GJKEngine GJK;
				static bool GJKInitDone=false;
				if(!GJKInitDone)
				{
					GJK.Enable(GJK_BACKUP_PROCEDURE);
					GJK.Enable(GJK_DEGENERATE);
					GJK.Enable(GJK_HILLCLIMBING);
					GJKInitDone = true;
				}
				GJK.SetCallbackObj0(Local::SVCallback);
				GJK.SetCallbackObj1(Local::SVCallback);
				GJK.SetUserData0(udword(cache.Model0->GetHull()));
				GJK.SetUserData1(udword(cache.Model1->GetHull()));
				Collide = GJK.Collide(*world0, *world1, &cache.SepVector);
			}
			else
			{
				static SVEngine SVE;
				SVE.SetCallbackObj0(Local::SVCallback);
				SVE.SetCallbackObj1(Local::SVCallback);
				SVE.SetUserData0(udword(cache.Model0->GetHull()));
				SVE.SetUserData1(udword(cache.Model1->GetHull()));
				Collide = SVE.Collide(*world0, *world1, &cache.SepVector);
			}

			if(!Collide)
			{
		// Reset stats & contact status
		mFlags &= ~OPC_CONTACT;
		mNbBVBVTests		= 0;
		mNbPrimPrimTests	= 0;
		mNbBVPrimTests		= 0;
		mPairs.Reset();
		return true;
			}
		}
	}

	// Here, hulls collide
	cache.HullTest = false;
#endif // __MESHMERIZER_H__

	// Checkings
	if(!Setup(cache.Model0->GetMeshInterface(), cache.Model1->GetMeshInterface()))	return false;

	// Simple double-dispatch
	bool Status;
	if(!cache.Model0->HasLeafNodes())
	{
		if(cache.Model0->IsQuantized())
		{
			const AABBQuantizedNoLeafTree* T0 = (const AABBQuantizedNoLeafTree*)cache.Model0->GetTree();
			const AABBQuantizedNoLeafTree* T1 = (const AABBQuantizedNoLeafTree*)cache.Model1->GetTree();
			Status = Collide(T0, T1, world0, world1, &cache);
		}
		else
		{
			const AABBNoLeafTree* T0 = (const AABBNoLeafTree*)cache.Model0->GetTree();
			const AABBNoLeafTree* T1 = (const AABBNoLeafTree*)cache.Model1->GetTree();
			Status = Collide(T0, T1, world0, world1, &cache);
		}
	}
	else
	{
		if(cache.Model0->IsQuantized())
		{
			const AABBQuantizedTree* T0 = (const AABBQuantizedTree*)cache.Model0->GetTree();
			const AABBQuantizedTree* T1 = (const AABBQuantizedTree*)cache.Model1->GetTree();
			Status = Collide(T0, T1, world0, world1, &cache);
		}
		else
		{
			const AABBCollisionTree* T0 = (const AABBCollisionTree*)cache.Model0->GetTree();
			const AABBCollisionTree* T1 = (const AABBCollisionTree*)cache.Model1->GetTree();
			Status = Collide(T0, T1, world0, world1, &cache);
		}
	}

#ifdef __MESHMERIZER_H__
	if(Status)
	{
		// Reset counter as long as overlap occurs
		if(GetContactStatus())	cache.ResetCountDown();

		// Enable hull test again when counter reaches zero
		cache.CountDown--;
		if(!cache.CountDown)
		{
			cache.ResetCountDown();
			cache.HullTest = true;
		}
	}
#endif
	return Status;
}